

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus.c
# Opt level: O0

void bus0_pipe_send_cb(void *arg)

{
  nng_err nVar1;
  int iVar2;
  nni_msg *m;
  nni_msg *local_28;
  nni_msg *msg;
  bus0_sock *s;
  bus0_pipe *p;
  void *arg_local;
  
  msg = *(nni_msg **)((long)arg + 8);
  s = (bus0_sock *)arg;
  p = (bus0_pipe *)arg;
  nVar1 = nni_aio_result((nni_aio *)((long)arg + 0x238));
  if (nVar1 == NNG_OK) {
    nni_mtx_lock((nni_mtx *)(msg->m_header_buf + 6));
    iVar2 = nni_lmq_get((nni_lmq *)&(s->pipes).ll_offset,&local_28);
    if (iVar2 == 0) {
      nni_aio_set_msg((nni_aio *)&s[2].recv_wait,local_28);
      nni_pipe_send((nni_pipe *)(s->pipes).ll_head.ln_next,(nni_aio *)&s[2].recv_wait);
    }
    else {
      *(undefined1 *)&(s->recv_msgs).lmq_alloc = 0;
    }
    nni_mtx_unlock((nni_mtx *)(msg->m_header_buf + 6));
  }
  else {
    m = nni_aio_get_msg((nni_aio *)&s[2].recv_wait);
    nni_msg_free(m);
    nni_aio_set_msg((nni_aio *)&s[2].recv_wait,(nni_msg *)0x0);
    nni_pipe_close((nni_pipe *)(s->pipes).ll_head.ln_next);
  }
  return;
}

Assistant:

static void
bus0_pipe_send_cb(void *arg)
{
	bus0_pipe *p = arg;
	bus0_sock *s = p->bus;
	nni_msg   *msg;

	if (nni_aio_result(&p->aio_send) != 0) {
		// closed?
		nni_msg_free(nni_aio_get_msg(&p->aio_send));
		nni_aio_set_msg(&p->aio_send, NULL);
		nni_pipe_close(p->pipe);
		return;
	}

	nni_mtx_lock(&s->mtx);
	if (nni_lmq_get(&p->send_queue, &msg) == 0) {
		nni_aio_set_msg(&p->aio_send, msg);
		nni_pipe_send(p->pipe, &p->aio_send);
	} else {
		p->busy = false;
	}
	nni_mtx_unlock(&s->mtx);
}